

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

undefined8 Game::Graphics::YouWinPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream local_198 [8];
  ostringstream win_richtext;
  char *sp;
  char *win_game_text;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = Color::operator<<((ostream *)local_198,&green);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,"You win! Congratulations!");
  poVar1 = Color::operator<<(poVar1,&def);
  poVar1 = Color::operator<<(poVar1,&bold_off);
  std::operator<<(poVar1,"\n\n\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string YouWinPrompt() {
  constexpr auto win_game_text = "You win! Congratulations!";
  constexpr auto sp = "  ";
  std::ostringstream win_richtext;
  win_richtext << green << bold_on << sp << win_game_text << def << bold_off
               << "\n\n\n";
  return win_richtext.str();
}